

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O1

void __thiscall VFS::CVFS::CVFSDir::InternalAppendChild(CVFSDir *this,VFSNode *Child)

{
  vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_> *this_00;
  element_type *peVar1;
  pointer pcVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  undefined8 uVar6;
  ulong __n;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long *local_70;
  ulong local_68;
  long local_60 [2];
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  this_00 = &this->m_Childs;
  if ((this->m_Childs).
      super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->m_Childs).
      super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar9 = 0;
  }
  else {
    lVar8 = 0;
    uVar9 = 0;
    do {
      peVar1 = (Child->super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      iVar5 = pthread_mutex_lock((pthread_mutex_t *)&peVar1->m_UpdateLock);
      if (iVar5 != 0) {
        iVar5 = std::__throw_system_error(iVar5);
LAB_0010b91a:
        uVar6 = std::__throw_system_error(iVar5);
        if (local_70 != local_60) {
          operator_delete(local_70,local_60[0] + 1);
        }
        _Unwind_Resume(uVar6);
      }
      pcVar2 = (peVar1->m_Name)._M_dataplus._M_p;
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar2,pcVar2 + (peVar1->m_Name)._M_string_length);
      pthread_mutex_unlock((pthread_mutex_t *)&peVar1->m_UpdateLock);
      lVar7 = *(long *)((long)&(((this_00->
                                 super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->
                               super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                       + lVar8);
      iVar5 = pthread_mutex_lock((pthread_mutex_t *)(lVar7 + 0x40));
      if (iVar5 != 0) goto LAB_0010b91a;
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,*(long *)(lVar7 + 8),
                 *(long *)(lVar7 + 0x10) + *(long *)(lVar7 + 8));
      pthread_mutex_unlock((pthread_mutex_t *)(lVar7 + 0x40));
      uVar4 = local_48;
      uVar3 = local_68;
      __n = local_68;
      if (local_48 < local_68) {
        __n = local_48;
      }
      if (__n == 0) {
        iVar5 = 0;
      }
      else {
        iVar5 = memcmp(local_70,local_50,__n);
      }
      if (iVar5 == 0) {
        lVar7 = uVar3 - uVar4;
        if (lVar7 < -0x7fffffff) {
          lVar7 = -0x80000000;
        }
        if (0x7ffffffe < lVar7) {
          lVar7 = 0x7fffffff;
        }
        iVar5 = (int)lVar7;
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      if (iVar5 < 0) break;
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x10;
    } while (uVar9 < (ulong)((long)(this->m_Childs).
                                   super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_Childs).
                                   super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  std::vector<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>::
  insert(this_00,(this_00->
                 super__Vector_base<std::shared_ptr<VFS::CVFSNode>,_std::allocator<std::shared_ptr<VFS::CVFSNode>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar9,Child);
  return;
}

Assistant:

void InternalAppendChild(VFSNode Child)
                    {
                        size_t Pos = 0;

                        //Sorts the data ascending.
                        for (Pos = 0; Pos < m_Childs.size(); Pos++)
                        {
                            if(Child->Name() < m_Childs[Pos]->Name())
                                break;
                        }
                        
                        m_Childs.insert(m_Childs.begin() + Pos, Child);
                    }